

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O1

void mxx::impl::all2allv_big<std::pair<int,int>>
               (pair<int,_int> *msgs,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *send_displs,
               pair<int,_int> *out,vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes
               ,vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_displs,comm *comm)

{
  unsigned_long uVar1;
  MPI_Comm poVar2;
  ulong uVar3;
  MPI_Datatype poVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  datatype dt_1;
  requests reqs;
  datatype dt;
  datatype local_b8;
  int local_9c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_98;
  undefined1 local_90 [8];
  pointer local_88;
  pointer ppoStack_80;
  pointer local_78;
  datatype local_70;
  pair<int,_int> *local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_48;
  pair<int,_int> *local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  
  local_98 = recv_sizes;
  local_58 = msgs;
  local_50 = send_displs;
  local_48 = send_sizes;
  local_40 = out;
  local_38 = recv_displs;
  if (comm->m_size !=
      (int)((ulong)((long)(send_sizes->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_finish -
                   (long)(send_sizes->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 3)) {
    MPI_Comm_rank(&ompi_mpi_comm_world,local_90);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_90 & 0xffffffff,
           "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/big_collective.hpp"
           ,0x131,"all2allv_big","static_cast<int>(send_sizes.size()) == comm.size()");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  if (comm->m_size !=
      (int)((ulong)((long)(local_98->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_finish -
                   (long)(local_98->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 3)) {
    MPI_Comm_rank(&ompi_mpi_comm_world,local_90);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_90 & 0xffffffff,
           "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/big_collective.hpp"
           ,0x132,"all2allv_big","static_cast<int>(recv_sizes.size()) == comm.size()");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  local_90 = (undefined1  [8])&PTR__requests_0014c300;
  local_88 = (pointer)0x0;
  ppoStack_80 = (pointer)0x0;
  local_78 = (pointer)0x0;
  iVar6 = comm->m_size;
  if (0 < iVar6) {
    iVar5 = 0;
    iVar7 = 0;
    do {
      uVar3 = (long)(comm->m_rank + iVar6 + iVar5) % (long)iVar6;
      local_b8.mpitype = datatype_builder<std::pair<int,_int>_>::get_type();
      local_b8._vptr_datatype = (_func_int **)&PTR__datatype_0014c1f0;
      local_b8.builtin = false;
      iVar6 = (int)uVar3;
      local_9c = iVar5;
      datatype::contiguous
                (&local_70,&local_b8,
                 (local_98->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[iVar6]);
      datatype::~datatype(&local_b8);
      poVar4 = local_70.mpitype;
      uVar1 = (local_38->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar6];
      poVar2 = comm->mpi_comm;
      local_b8._vptr_datatype = (_func_int **)0x0;
      std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::emplace_back<ompi_request_t*>
                ((vector<ompi_request_t*,std::allocator<ompi_request_t*>> *)&local_88,
                 (ompi_request_t **)&local_b8);
      MPI_Irecv(local_40 + uVar1,1,poVar4,uVar3 & 0xffffffff,0x3039,poVar2,ppoStack_80 + -1);
      datatype::~datatype(&local_70);
      iVar7 = iVar7 + 1;
      iVar6 = comm->m_size;
      iVar5 = local_9c + -1;
    } while (iVar7 < iVar6);
  }
  iVar6 = comm->m_size;
  if (0 < iVar6) {
    iVar5 = 0;
    do {
      uVar3 = (long)(comm->m_rank + iVar5) % (long)iVar6;
      local_b8.mpitype = datatype_builder<std::pair<int,_int>_>::get_type();
      local_b8._vptr_datatype = (_func_int **)&PTR__datatype_0014c1f0;
      local_b8.builtin = false;
      iVar6 = (int)uVar3;
      datatype::contiguous
                (&local_70,&local_b8,
                 (local_48->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[iVar6]);
      datatype::~datatype(&local_b8);
      poVar4 = local_70.mpitype;
      uVar1 = (local_50->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar6];
      poVar2 = comm->mpi_comm;
      local_b8._vptr_datatype = (_func_int **)0x0;
      std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::emplace_back<ompi_request_t*>
                ((vector<ompi_request_t*,std::allocator<ompi_request_t*>> *)&local_88,
                 (ompi_request_t **)&local_b8);
      MPI_Isend(local_58 + uVar1,1,poVar4,uVar3 & 0xffffffff,0x3039,poVar2,ppoStack_80 + -1);
      datatype::~datatype(&local_70);
      iVar5 = iVar5 + 1;
      iVar6 = comm->m_size;
    } while (iVar5 < iVar6);
  }
  MPI_Waitall((ulong)((long)ppoStack_80 - (long)local_88) >> 3,local_88,0);
  requests::~requests((requests *)local_90);
  return;
}

Assistant:

void all2allv_big(const T* msgs, const std::vector<size_t>& send_sizes, const std::vector<size_t>& send_displs, T* out, const std::vector<size_t>& recv_sizes, const std::vector<size_t>& recv_displs, const mxx::comm& comm = mxx::comm()) {
    // point-to-point implementation
    // TODO: implement MPI_Alltoallw variant
    // TODO: try RMA
    MXX_ASSERT(static_cast<int>(send_sizes.size()) == comm.size());
    MXX_ASSERT(static_cast<int>(recv_sizes.size()) == comm.size());
    // TODO: unify tag usage
    int tag = 12345;
    // implementing this using point-to-point communication!
    // dispatch receives
    mxx::requests reqs;
    for (int i = 0; i < comm.size(); ++i) {
        // start with self send/recv
        int recv_from = (comm.rank() + (comm.size()-i)) % comm.size();
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_sizes[recv_from]);
        MPI_Irecv(const_cast<T*>(&(*out)) + recv_displs[recv_from], 1, dt.type(),
                  recv_from, tag, comm, &reqs.add());
    }
    // dispatch sends
    for (int i = 0; i < comm.size(); ++i) {
        int send_to = (comm.rank() + i) % comm.size();
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(send_sizes[send_to]);
        MPI_Isend(const_cast<T*>(msgs)+send_displs[send_to], 1, dt.type(), send_to,
                  tag, comm, &reqs.add());
    }

    reqs.wait();
}